

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void PClass::StaticShutdown(void)

{
  PClass *pPVar1;
  size_t *psVar2;
  uint uVar3;
  PClass **ppPVar4;
  unsigned_long **ppuVar5;
  FAutoSegIterator *this;
  NCREGINFO pvVar6;
  undefined8 *puVar7;
  undefined1 local_58 [8];
  FAutoSegIterator probe;
  PClass *type;
  uint local_20;
  uint local_1c;
  uint j;
  uint i;
  TArray<unsigned_long_*,_unsigned_long_*> uniqueFPs;
  
  TArray<unsigned_long_*,_unsigned_long_*>::TArray
            ((TArray<unsigned_long_*,_unsigned_long_*> *)&j,0x40);
  FS_Close();
  for (local_1c = 0; uVar3 = TArray<PClass_*,_PClass_*>::Size(&AllClasses), local_1c < uVar3;
      local_1c = local_1c + 1) {
    ppPVar4 = TArray<PClass_*,_PClass_*>::operator[](&AllClasses,(ulong)local_1c);
    pPVar1 = *ppPVar4;
    ppPVar4 = TArray<PClass_*,_PClass_*>::operator[](&AllClasses,(ulong)local_1c);
    *ppPVar4 = (PClass *)0x0;
    if ((pPVar1->FlatPointers != &TheEnd) && (pPVar1->FlatPointers != pPVar1->Pointers)) {
      local_20 = 0;
      while ((uVar3 = TArray<unsigned_long_*,_unsigned_long_*>::Size
                                ((TArray<unsigned_long_*,_unsigned_long_*> *)&j), local_20 < uVar3
             && (psVar2 = pPVar1->FlatPointers,
                ppuVar5 = TArray<unsigned_long_*,_unsigned_long_*>::operator[]
                                    ((TArray<unsigned_long_*,_unsigned_long_*> *)&j,(ulong)local_20)
                , psVar2 != *ppuVar5))) {
        local_20 = local_20 + 1;
      }
      uVar3 = TArray<unsigned_long_*,_unsigned_long_*>::Size
                        ((TArray<unsigned_long_*,_unsigned_long_*> *)&j);
      if (local_20 == uVar3) {
        probe.Tail = (REGINFO *)pPVar1->FlatPointers;
        TArray<unsigned_long_*,_unsigned_long_*>::Push
                  ((TArray<unsigned_long_*,_unsigned_long_*> *)&j,(unsigned_long **)&probe.Tail);
      }
    }
  }
  for (local_1c = 0;
      uVar3 = TArray<unsigned_long_*,_unsigned_long_*>::Size
                        ((TArray<unsigned_long_*,_unsigned_long_*> *)&j), local_1c < uVar3;
      local_1c = local_1c + 1) {
    ppuVar5 = TArray<unsigned_long_*,_unsigned_long_*>::operator[]
                        ((TArray<unsigned_long_*,_unsigned_long_*> *)&j,(ulong)local_1c);
    if (*ppuVar5 != (unsigned_long *)0x0) {
      operator_delete__(*ppuVar5);
    }
  }
  FTypeTable::Clear(&TypeTable);
  bShutdown = true;
  TArray<PClass_*,_PClass_*>::Clear(&AllClasses);
  TArray<PClassActor_*,_PClassActor_*>::Clear(&PClassActor::AllActorClasses);
  FAutoSegIterator::FAutoSegIterator((FAutoSegIterator *)local_58,&CRegHead,&CRegTail);
  while( true ) {
    this = FAutoSegIterator::operator++((FAutoSegIterator *)local_58);
    pvVar6 = FAutoSegIterator::operator*(this);
    if (pvVar6 == (NCREGINFO)0x0) break;
    puVar7 = (undefined8 *)FAutoSegIterator::operator*((FAutoSegIterator *)local_58);
    *puVar7 = 0;
  }
  TArray<unsigned_long_*,_unsigned_long_*>::~TArray((TArray<unsigned_long_*,_unsigned_long_*> *)&j);
  return;
}

Assistant:

void PClass::StaticShutdown ()
{
	TArray<size_t *> uniqueFPs(64);
	unsigned int i, j;

	FS_Close();	// this must be done before the classes get deleted.
	for (i = 0; i < PClass::AllClasses.Size(); ++i)
	{
		PClass *type = PClass::AllClasses[i];
		PClass::AllClasses[i] = NULL;
		if (type->FlatPointers != &TheEnd && type->FlatPointers != type->Pointers)
		{
			// FlatPointers are shared by many classes, so we must check for
			// duplicates and only delete those that are unique.
			for (j = 0; j < uniqueFPs.Size(); ++j)
			{
				if (type->FlatPointers == uniqueFPs[j])
				{
					break;
				}
			}
			if (j == uniqueFPs.Size())
			{
				uniqueFPs.Push(const_cast<size_t *>(type->FlatPointers));
			}
		}
	}
	for (i = 0; i < uniqueFPs.Size(); ++i)
	{
		delete[] uniqueFPs[i];
	}
	TypeTable.Clear();
	bShutdown = true;

	AllClasses.Clear();
	PClassActor::AllActorClasses.Clear();

	FAutoSegIterator probe(CRegHead, CRegTail);

	while (*++probe != NULL)
	{
		((ClassReg *)*probe)->MyClass = NULL;
	}

}